

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

u_char * ngx_utf8_cpystrn(u_char *dst,u_char *src,size_t n,size_t len)

{
  uint32_t uVar1;
  u_char *local_40;
  u_char *next;
  size_t sStack_30;
  u_char c;
  size_t len_local;
  size_t n_local;
  u_char *src_local;
  u_char *dst_local;
  
  sStack_30 = len;
  len_local = n;
  n_local = (size_t)src;
  src_local = dst;
  dst_local = dst;
  if (n != 0) {
    while (len_local = len_local - 1, len_local != 0) {
      next._7_1_ = *(byte *)n_local;
      *src_local = next._7_1_;
      if (next._7_1_ < 0x80) {
        if (next._7_1_ == 0) {
          return src_local;
        }
        src_local = src_local + 1;
        n_local = n_local + 1;
        sStack_30 = sStack_30 - 1;
      }
      else {
        local_40 = (u_char *)n_local;
        uVar1 = ngx_utf8_decode(&local_40,sStack_30);
        if (0x10ffff < uVar1) break;
        while (n_local < local_40) {
          *src_local = *(u_char *)n_local;
          sStack_30 = sStack_30 - 1;
          n_local = n_local + 1;
          src_local = src_local + 1;
        }
      }
    }
    *src_local = '\0';
    dst_local = src_local;
  }
  return dst_local;
}

Assistant:

u_char *
ngx_utf8_cpystrn(u_char *dst, u_char *src, size_t n, size_t len)
{
    u_char  c, *next;

    if (n == 0) {
        return dst;
    }

    while (--n) {

        c = *src;
        *dst = c;

        if (c < 0x80) {

            if (c != '\0') {
                dst++;
                src++;
                len--;

                continue;
            }

            return dst;
        }

        next = src;

        if (ngx_utf8_decode(&next, len) > 0x10ffff) {
            /* invalid UTF-8 */
            break;
        }

        while (src < next) {
            *dst++ = *src++;
            len--;
        }
    }

    *dst = '\0';

    return dst;
}